

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O1

ChFrame<double> * __thiscall
chrono::ChFrame<double>::operator>>=(ChFrame<double> *this,ChQuaternion<double> *R)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  ChQuaternion<double> q;
  ChVector<double> local_40;
  ChQuaternion<double> local_28;
  
  dVar1 = R->m_data[0];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar1;
  dVar2 = R->m_data[1];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar2;
  dVar9 = dVar1 * dVar1;
  dVar3 = R->m_data[2];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar3;
  dVar4 = R->m_data[3];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar4;
  auVar19 = ZEXT816(0xbff0000000000000);
  auVar22 = ZEXT816(0x4000000000000000);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar9 + dVar2 * dVar2;
  auVar11 = vfmadd213sd_fma(auVar13,auVar22,auVar19);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar1 * dVar4;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar2 * dVar3;
  auVar10 = vsubsd_avx512f(auVar31,auVar27);
  auVar10 = vaddsd_avx512f(auVar10,auVar10);
  dVar5 = (this->coord).pos.m_data[0];
  dVar6 = (this->coord).pos.m_data[1];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar6;
  auVar10 = vmulsd_avx512f(auVar34,auVar10);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar5;
  auVar11 = vfmadd231sd_avx512f(auVar10,auVar32,auVar11);
  dVar8 = dVar1 * dVar3 + dVar2 * dVar4;
  dVar7 = (this->coord).pos.m_data[2];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar8 + dVar8;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar7;
  auVar10 = vfmadd213sd_avx512f(auVar18,auVar36,auVar11);
  dVar8 = dVar2 * dVar3 + dVar1 * dVar4;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar9 + dVar3 * dVar3;
  auVar11 = vfmadd213sd_fma(auVar20,auVar22,auVar19);
  auVar11 = vmulsd_avx512f(auVar11,auVar34);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar8 + dVar8;
  auVar11 = vfmadd231sd_avx512f(auVar11,auVar32,auVar28);
  dVar8 = dVar3 * dVar4 - dVar1 * dVar2;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar8 + dVar8;
  auVar12 = vfmadd213sd_avx512f(auVar29,auVar36,auVar11);
  dVar8 = dVar2 * dVar4 - dVar1 * dVar3;
  dVar1 = dVar1 * dVar2 + dVar3 * dVar4;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar1 + dVar1;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar6;
  auVar11 = vmulsd_avx512f(auVar35,auVar24);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar8 + dVar8;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar5;
  auVar13 = vfmadd231sd_avx512f(auVar11,auVar33,auVar21);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar9 + dVar4 * dVar4;
  auVar11 = vfmadd213sd_fma(auVar11,auVar22,auVar19);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar7;
  auVar11 = vfmadd213sd_avx512f(auVar11,auVar37,auVar13);
  local_40.m_data[0] = auVar10._0_8_;
  local_40.m_data[1] = auVar12._0_8_;
  local_40.m_data[2] = auVar11._0_8_;
  dVar1 = (this->coord).rot.m_data[0];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar1;
  dVar5 = (this->coord).rot.m_data[1];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar5;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar5 * dVar2;
  auVar11 = vfmsub231sd_fma(auVar22,auVar15,auVar12);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = (this->coord).rot.m_data[2];
  auVar11 = vfnmadd231sd_fma(auVar11,auVar16,auVar23);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = (this->coord).rot.m_data[3];
  auVar12 = vfnmadd231sd_fma(auVar11,auVar17,auVar25);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar2 * dVar1;
  auVar11 = vfmadd231sd_fma(auVar26,auVar15,auVar19);
  auVar11 = vfnmadd231sd_fma(auVar11,auVar17,auVar23);
  auVar11 = vfmadd231sd_fma(auVar11,auVar16,auVar25);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar3 * dVar1;
  auVar10 = vfmadd231sd_fma(auVar30,auVar15,auVar23);
  auVar10 = vfmadd231sd_fma(auVar10,auVar17,auVar19);
  auVar13 = vfnmadd231sd_fma(auVar10,auVar14,auVar25);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar4 * dVar1;
  auVar10 = vfmadd231sd_fma(auVar10,auVar15,auVar25);
  auVar10 = vfnmadd231sd_fma(auVar10,auVar16,auVar19);
  auVar10 = vfmadd231sd_fma(auVar10,auVar14,auVar23);
  local_28.m_data[0] = auVar12._0_8_;
  local_28.m_data[1] = auVar11._0_8_;
  local_28.m_data[2] = auVar13._0_8_;
  local_28.m_data[3] = auVar10._0_8_;
  SetCoord(this,&local_40,&local_28);
  return this;
}

Assistant:

ChFrame<Real>& operator>>=(const ChQuaternion<Real>& R) {
        this->SetCoord(R.Rotate(this->coord.pos), this->coord.rot >> R);
        return *this;
    }